

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_object.cpp
# Opt level: O3

global_object_create_result *
mjs::make_date_object
          (global_object_create_result *__return_storage_ptr__,
          gc_heap_ptr<mjs::global_object> *global)

{
  slot sVar1;
  gc_heap_ptr<mjs::global_object> *global_00;
  global_object_create_result *pgVar2;
  long *plVar3;
  function_object *pfVar4;
  void *pvVar5;
  void *pvVar6;
  long *plVar7;
  gc_heap_ptr<mjs::function_object> o_1;
  gc_heap_ptr<mjs::function_object> o;
  gc_heap_ptr<mjs::function_object> o_20;
  value p;
  gc_heap_ptr<mjs::gc_function> p_1;
  anon_class_24_3_cfd939b3 make_date_mutator;
  anon_class_32_2_842af841 get_data_object;
  gc_heap_ptr<mjs::date_object> prototype;
  gc_heap_ptr<mjs::function_object> c;
  anon_class_16_2_4c7e7635 make_simple_date_mutator;
  anon_class_16_1_f1e7abc2 new_date;
  anon_class_16_2_9fb1826f copy_func;
  string_view local_190;
  gc_heap_ptr_untyped local_180;
  slot local_170;
  uint32_t local_168;
  gc_heap_ptr_untyped local_160;
  slot local_150;
  slot local_148;
  slot local_140;
  uint32_t local_138;
  gc_heap_ptr_untyped local_130;
  undefined1 local_120 [16];
  undefined1 local_110 [24];
  slot local_f8;
  gc_heap_ptr<mjs::global_object> *local_f0;
  slot *local_e8;
  slot local_e0;
  char *local_d8;
  gc_heap_ptr_untyped local_d0;
  slot local_c0;
  uint32_t local_b8;
  slot local_b0;
  uint32_t local_a8;
  string_view local_a0;
  slot local_90;
  uint32_t local_88;
  gc_heap_ptr_untyped local_80;
  anon_class_16_2_4c7e7635 local_70;
  slot local_60;
  uint32_t local_58;
  global_object_create_result *local_50;
  gc_heap *local_48;
  anon_class_16_2_9fb1826f local_40;
  
  local_48 = (global->super_gc_heap_ptr_untyped).heap_;
  local_120._0_8_ = (gc_heap *)0x4;
  local_120._8_8_ = (long)"getUTCDate" + 6;
  local_50 = __return_storage_ptr__;
  string::string((string *)&local_150.allocation,local_48,(string_view *)local_120);
  plVar3 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  (**(code **)(*plVar3 + 0x58))(&local_d0,plVar3);
  local_f8.new_position = 0x7fc00000;
  gc_heap::allocate_and_construct<mjs::date_object,mjs::string,mjs::gc_heap_ptr<mjs::object>,float>
            ((gc_heap *)&local_b0.allocation,(size_t)local_48,(string *)0x28,
             (gc_heap_ptr<mjs::object> *)&local_150.allocation,(float *)&local_d0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_150.allocation);
  local_60.representation = local_b0.representation;
  local_58 = local_a8;
  if ((gc_heap *)local_b0.representation == (gc_heap *)0x0) {
    local_150.representation = 0;
    local_148.new_position = local_a8;
  }
  else {
    gc_heap::attach((gc_heap *)local_b0,(gc_heap_ptr_untyped *)&local_60.allocation);
    local_150.representation = local_b0.representation;
    local_148.new_position = local_a8;
    if ((gc_heap *)local_b0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_b0,(gc_heap_ptr_untyped *)&local_150.allocation);
    }
  }
  local_140.representation = local_60.representation;
  local_138 = local_58;
  if ((gc_heap *)local_60.representation != (gc_heap *)0x0) {
    gc_heap::attach((gc_heap *)local_60,(gc_heap_ptr_untyped *)&local_140.allocation);
  }
  gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_b0.allocation);
  object::class_name((object *)&local_f8.allocation);
  make_raw_function((mjs *)&local_80,global);
  pfVar4 = (function_object *)gc_heap_ptr_untyped::get(&local_80);
  local_d0.heap_ = (gc_heap *)0x0;
  local_d0.pos_ = 0;
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)local_120,(size_t)(pfVar4->super_native_object).super_object.heap_);
  pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_120);
  *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d5d58;
  ((slot *)((long)pvVar5 + 0x10))->representation = (uint64_t)local_150;
  *(uint32_t *)((long)pvVar5 + 0x18) = local_148.new_position;
  if ((gc_heap *)local_150.representation != (gc_heap *)0x0) {
    gc_heap::attach((gc_heap *)local_150,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x10));
  }
  ((slot *)((long)pvVar5 + 0x20))->representation = (uint64_t)local_140;
  *(uint32_t *)((long)pvVar5 + 0x28) = local_138;
  if ((gc_heap *)local_140.representation != (gc_heap *)0x0) {
    gc_heap::attach((gc_heap *)local_140,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x20));
  }
  function_object::put_function
            (pfVar4,(gc_heap_ptr<mjs::gc_function> *)local_120,
             (gc_heap_ptr<mjs::gc_string> *)&local_f8.allocation,
             (gc_heap_ptr<mjs::gc_string> *)&local_d0,7);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_120);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_f8.allocation);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_140.allocation);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_150.allocation);
  local_170.representation = local_60.representation;
  local_168 = local_58;
  if ((gc_heap *)local_60.representation != (gc_heap *)0x0) {
    gc_heap::attach((gc_heap *)local_60,(gc_heap_ptr_untyped *)&local_170.allocation);
  }
  pvVar5 = gc_heap_ptr_untyped::get(&local_80);
  gc_heap::allocate_and_construct<mjs::gc_function>
            ((gc_heap *)&local_150.allocation,*(size_t *)((long)pvVar5 + 8));
  pvVar6 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_150.allocation);
  *(undefined ***)((long)pvVar6 + 8) = &PTR_destroy_001d5d98;
  ((slot *)((long)pvVar6 + 0x10))->representation = (uint64_t)local_170;
  *(uint32_t *)((long)pvVar6 + 0x18) = local_168;
  if ((gc_heap *)local_170.representation != (gc_heap *)0x0) {
    gc_heap::attach((gc_heap *)local_170,(gc_heap_ptr_untyped *)((long)pvVar6 + 0x10));
  }
  if ((*(int *)((long)pvVar5 + 0x28) == 0) &&
     ((gc_heap *)local_150.representation != (gc_heap *)0x0)) {
    *(uint32_t *)((long)pvVar5 + 0x28) = local_148.new_position;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_150.allocation);
    pvVar5 = gc_heap_ptr_untyped::get(&local_80);
    value_representation::get_value
              ((value *)&local_150.allocation,(value_representation *)((long)pvVar5 + 0x38),
               *(gc_heap **)((long)pvVar5 + 8));
    if (local_150.new_position != 5) {
      __assert_fail("p.type() == value_type::object",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/function_object.h"
                    ,0x59,
                    "void mjs::make_constructable(const gc_heap_ptr<global_object> &, gc_heap_ptr<function_object> &, const F &) [F = (lambda at /workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/date_object.cpp:310:35)]"
                   );
    }
    pvVar5 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    if (*(int *)((long)pvVar5 + 0x20) < 1) {
      if (local_150.new_position != 5) {
        __assert_fail("type_ == value_type::object",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h"
                      ,0x46,"const object_ptr &mjs::value::object_value() const");
      }
      plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_148.allocation);
      plVar7 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
      (**(code **)(*plVar7 + 0x98))(&local_d0,plVar7,"constructor");
      local_f8.representation = (uint64_t)local_80.heap_;
      local_f0 = (gc_heap_ptr<mjs::global_object> *)CONCAT44(local_f0._4_4_,local_80.pos_);
      if (local_80.heap_ == (gc_heap *)0x0) {
        local_120._0_4_ = 5;
        local_120._8_8_ = (gc_heap *)0x0;
        local_110._0_4_ = local_80.pos_;
      }
      else {
        gc_heap::attach(local_80.heap_,(gc_heap_ptr_untyped *)&local_f8.allocation);
        local_120._0_4_ = 5;
        local_120._8_8_ = local_f8;
        local_110._0_4_ = (uint32_t)local_f0;
        if ((gc_heap *)local_f8.representation != (gc_heap *)0x0) {
          gc_heap::attach((gc_heap *)local_f8,(gc_heap_ptr_untyped *)(local_120 + 8));
        }
      }
      (**(code **)(*plVar3 + 8))(plVar3,&local_d0,local_120,2);
      value::destroy((value *)local_120);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_f8.allocation);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d0);
    }
    value::destroy((value *)&local_150.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_170.allocation);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_b0.allocation);
    plVar7 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    (**(code **)(*plVar7 + 0x98))(local_120,plVar7,"constructor");
    local_d0.heap_ = local_80.heap_;
    local_d0.pos_ = local_80.pos_;
    if (local_80.heap_ == (gc_heap *)0x0) {
      local_150.new_position = 5;
      local_148.representation = 0;
      local_140.new_position = local_80.pos_;
    }
    else {
      gc_heap::attach(local_80.heap_,&local_d0);
      local_150.new_position = 5;
      local_148.representation = (uint64_t)local_d0.heap_;
      local_140.new_position = local_d0.pos_;
      if (local_d0.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)&local_148.allocation);
      }
    }
    (**(code **)(*plVar3 + 8))(plVar3,local_120,&local_150,2);
    value::destroy((value *)&local_150.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_120);
    local_160.heap_ = local_80.heap_;
    local_160.pos_ = local_80.pos_;
    if (local_80.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_80.heap_,&local_160);
    }
    local_190._M_len = 5;
    local_190._M_str = "parse";
    string::string((string *)&local_180,(global->super_gc_heap_ptr_untyped).heap_,&local_190);
    plVar3 = (long *)gc_heap_ptr_untyped::get(&local_160);
    make_raw_function((mjs *)&local_170.allocation,global);
    pfVar4 = (function_object *)
             gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_170.allocation);
    local_d0.heap_ = (gc_heap *)0x0;
    local_d0.pos_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_120,(size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_120);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d5dd8;
    *(gc_heap **)((long)pvVar5 + 0x10) = local_48;
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)local_120,
               (gc_heap_ptr<mjs::gc_string> *)&local_180,(gc_heap_ptr<mjs::gc_string> *)&local_d0,1)
    ;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_120);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d0);
    local_f8.representation = local_170.representation;
    local_f0 = (gc_heap_ptr<mjs::global_object> *)CONCAT44(local_f0._4_4_,local_168);
    if ((gc_heap *)local_170.representation == (gc_heap *)0x0) {
      local_150.new_position = 5;
      local_148.representation = 0;
      local_140.new_position = local_168;
    }
    else {
      gc_heap::attach((gc_heap *)local_170,(gc_heap_ptr_untyped *)&local_f8.allocation);
      local_150.new_position = 5;
      local_148.representation = local_f8.representation;
      local_140.new_position = (uint32_t)local_f0;
      if ((gc_heap *)local_f8.representation != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_f8,(gc_heap_ptr_untyped *)&local_148.allocation);
      }
    }
    (**(code **)(*plVar3 + 8))(plVar3,&local_180,&local_150,2);
    value::destroy((value *)&local_150.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_f8.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_170.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_180);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_160);
    local_160.heap_ = local_80.heap_;
    local_160.pos_ = local_80.pos_;
    if (local_80.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_80.heap_,&local_160);
    }
    local_190._M_len = 3;
    local_190._M_str = "UTC";
    string::string((string *)&local_180,(global->super_gc_heap_ptr_untyped).heap_,&local_190);
    plVar3 = (long *)gc_heap_ptr_untyped::get(&local_160);
    make_raw_function((mjs *)&local_170.allocation,global);
    pfVar4 = (function_object *)
             gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_170.allocation);
    local_d0.heap_ = (gc_heap *)0x0;
    local_d0.pos_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)local_120,(size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_120);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d5e18;
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)local_120,
               (gc_heap_ptr<mjs::gc_string> *)&local_180,(gc_heap_ptr<mjs::gc_string> *)&local_d0,7)
    ;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_120);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d0);
    local_f8.representation = local_170.representation;
    local_f0 = (gc_heap_ptr<mjs::global_object> *)CONCAT44(local_f0._4_4_,local_168);
    if ((gc_heap *)local_170.representation == (gc_heap *)0x0) {
      local_150.new_position = 5;
      local_148.representation = 0;
      local_140.new_position = local_168;
    }
    else {
      gc_heap::attach((gc_heap *)local_170,(gc_heap_ptr_untyped *)&local_f8.allocation);
      local_150.new_position = 5;
      local_148.representation = local_f8.representation;
      local_140.new_position = (uint32_t)local_f0;
      if ((gc_heap *)local_f8.representation != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_f8,(gc_heap_ptr_untyped *)&local_148.allocation);
      }
    }
    (**(code **)(*plVar3 + 8))(plVar3,&local_180,&local_150,2);
    value::destroy((value *)&local_150.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_f8.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_170.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_180);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_160);
    local_d0.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
    local_d0.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
    if (local_d0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d0.heap_,&local_d0);
    }
    local_c0.representation = local_b0.representation;
    local_b8 = local_a8;
    if ((gc_heap *)local_b0.representation == (gc_heap *)0x0) {
      local_e0.representation = 0;
      local_d8 = (char *)CONCAT44(local_d8._4_4_,local_a8);
    }
    else {
      gc_heap::attach((gc_heap *)local_b0,(gc_heap_ptr_untyped *)&local_c0.allocation);
      local_e0.representation = local_b0.representation;
      local_d8 = (char *)CONCAT44(local_d8._4_4_,local_a8);
      if ((gc_heap *)local_b0.representation != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_b0,(gc_heap_ptr_untyped *)&local_e0.allocation);
      }
    }
    local_120._8_8_ = local_d0.heap_;
    local_110._0_4_ = local_d0.pos_;
    if (local_d0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)(local_120 + 8));
    }
    local_110._8_8_ = local_c0;
    local_110._16_4_ = local_b8;
    if ((gc_heap *)local_c0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_c0,(gc_heap_ptr_untyped *)(local_110 + 8));
    }
    local_a0._M_len = 7;
    local_a0._M_str = "valueOf";
    string::string((string *)&local_160,(global->super_gc_heap_ptr_untyped).heap_,&local_a0);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_e0.allocation);
    make_raw_function((mjs *)&local_190,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_190);
    local_170.representation = 0;
    local_168 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&local_f8.allocation,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_f8.allocation);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d5798;
    *(undefined8 *)((long)pvVar5 + 0x18) = local_120._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x20) = local_110._0_4_;
    if ((gc_heap *)local_120._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_120._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x18));
    }
    ((slot *)((long)pvVar5 + 0x28))->representation = local_110._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x30) = local_110._16_4_;
    if ((gc_heap *)local_110._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_110._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x28));
    }
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&local_f8.allocation,
               (gc_heap_ptr<mjs::gc_string> *)&local_160,
               (gc_heap_ptr<mjs::gc_string> *)&local_170.allocation,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_f8.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_170.allocation);
    local_180.heap_ = (gc_heap *)local_190._M_len;
    local_180.pos_ = (uint32_t)local_190._M_str;
    if ((gc_heap *)local_190._M_len == (gc_heap *)0x0) {
      local_150.new_position = 5;
      local_148.representation = 0;
      local_140.new_position = (uint32_t)local_190._M_str;
    }
    else {
      gc_heap::attach((gc_heap *)local_190._M_len,&local_180);
      local_150.new_position = 5;
      local_148.representation = (uint64_t)local_180.heap_;
      local_140.new_position = local_180.pos_;
      if (local_180.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_180.heap_,(gc_heap_ptr_untyped *)&local_148.allocation);
      }
    }
    (**(code **)(*plVar3 + 8))(plVar3,&local_160,&local_150,2);
    value::destroy((value *)&local_150.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_180);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_190);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_160);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_110 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_120 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_e0.allocation);
    local_e0.representation = local_b0.representation;
    local_d8 = (char *)CONCAT44(local_d8._4_4_,local_a8);
    if ((gc_heap *)local_b0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_b0,(gc_heap_ptr_untyped *)&local_e0.allocation);
    }
    local_120._8_8_ = local_d0.heap_;
    local_110._0_4_ = local_d0.pos_;
    if (local_d0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)(local_120 + 8));
    }
    local_110._8_8_ = local_c0;
    local_110._16_4_ = local_b8;
    if ((gc_heap *)local_c0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_c0,(gc_heap_ptr_untyped *)(local_110 + 8));
    }
    local_a0._M_len = 7;
    local_a0._M_str = "getTime";
    string::string((string *)&local_160,(global->super_gc_heap_ptr_untyped).heap_,&local_a0);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_e0.allocation);
    make_raw_function((mjs *)&local_190,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_190);
    local_170.representation = 0;
    local_168 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&local_f8.allocation,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_f8.allocation);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d57d8;
    *(undefined8 *)((long)pvVar5 + 0x18) = local_120._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x20) = local_110._0_4_;
    if ((gc_heap *)local_120._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_120._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x18));
    }
    ((slot *)((long)pvVar5 + 0x28))->representation = local_110._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x30) = local_110._16_4_;
    if ((gc_heap *)local_110._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_110._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x28));
    }
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&local_f8.allocation,
               (gc_heap_ptr<mjs::gc_string> *)&local_160,
               (gc_heap_ptr<mjs::gc_string> *)&local_170.allocation,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_f8.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_170.allocation);
    local_180.heap_ = (gc_heap *)local_190._M_len;
    local_180.pos_ = (uint32_t)local_190._M_str;
    if ((gc_heap *)local_190._M_len == (gc_heap *)0x0) {
      local_150.new_position = 5;
      local_148.representation = 0;
      local_140.new_position = (uint32_t)local_190._M_str;
    }
    else {
      gc_heap::attach((gc_heap *)local_190._M_len,&local_180);
      local_150.new_position = 5;
      local_148.representation = (uint64_t)local_180.heap_;
      local_140.new_position = local_180.pos_;
      if (local_180.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_180.heap_,(gc_heap_ptr_untyped *)&local_148.allocation);
      }
    }
    (**(code **)(*plVar3 + 8))(plVar3,&local_160,&local_150,2);
    value::destroy((value *)&local_150.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_180);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_190);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_160);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_110 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_120 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_e0.allocation);
    local_e0.representation = local_b0.representation;
    local_d8 = (char *)CONCAT44(local_d8._4_4_,local_a8);
    if ((gc_heap *)local_b0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_b0,(gc_heap_ptr_untyped *)&local_e0.allocation);
    }
    local_120._8_8_ = local_d0.heap_;
    local_110._0_4_ = local_d0.pos_;
    if (local_d0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)(local_120 + 8));
    }
    local_110._8_8_ = local_c0;
    local_110._16_4_ = local_b8;
    if ((gc_heap *)local_c0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_c0,(gc_heap_ptr_untyped *)(local_110 + 8));
    }
    local_a0._M_len = 7;
    local_a0._M_str = "getYear";
    string::string((string *)&local_160,(global->super_gc_heap_ptr_untyped).heap_,&local_a0);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_e0.allocation);
    make_raw_function((mjs *)&local_190,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_190);
    local_170.representation = 0;
    local_168 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&local_f8.allocation,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_f8.allocation);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d5818;
    *(undefined8 *)((long)pvVar5 + 0x18) = local_120._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x20) = local_110._0_4_;
    if ((gc_heap *)local_120._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_120._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x18));
    }
    ((slot *)((long)pvVar5 + 0x28))->representation = local_110._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x30) = local_110._16_4_;
    if ((gc_heap *)local_110._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_110._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x28));
    }
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&local_f8.allocation,
               (gc_heap_ptr<mjs::gc_string> *)&local_160,
               (gc_heap_ptr<mjs::gc_string> *)&local_170.allocation,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_f8.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_170.allocation);
    local_180.heap_ = (gc_heap *)local_190._M_len;
    local_180.pos_ = (uint32_t)local_190._M_str;
    if ((gc_heap *)local_190._M_len == (gc_heap *)0x0) {
      local_150.new_position = 5;
      local_148.representation = 0;
      local_140.new_position = (uint32_t)local_190._M_str;
    }
    else {
      gc_heap::attach((gc_heap *)local_190._M_len,&local_180);
      local_150.new_position = 5;
      local_148.representation = (uint64_t)local_180.heap_;
      local_140.new_position = local_180.pos_;
      if (local_180.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_180.heap_,(gc_heap_ptr_untyped *)&local_148.allocation);
      }
    }
    (**(code **)(*plVar3 + 8))(plVar3,&local_160,&local_150,2);
    value::destroy((value *)&local_150.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_180);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_190);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_160);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_110 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_120 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_e0.allocation);
    local_e0.representation = local_b0.representation;
    local_d8 = (char *)CONCAT44(local_d8._4_4_,local_a8);
    if ((gc_heap *)local_b0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_b0,(gc_heap_ptr_untyped *)&local_e0.allocation);
    }
    local_120._8_8_ = local_d0.heap_;
    local_110._0_4_ = local_d0.pos_;
    if (local_d0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)(local_120 + 8));
    }
    local_110._8_8_ = local_c0;
    local_110._16_4_ = local_b8;
    if ((gc_heap *)local_c0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_c0,(gc_heap_ptr_untyped *)(local_110 + 8));
    }
    local_a0._M_len = 0xb;
    local_a0._M_str = "getFullYear";
    string::string((string *)&local_160,(global->super_gc_heap_ptr_untyped).heap_,&local_a0);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_e0.allocation);
    make_raw_function((mjs *)&local_190,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_190);
    local_170.representation = 0;
    local_168 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&local_f8.allocation,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_f8.allocation);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d5858;
    *(undefined8 *)((long)pvVar5 + 0x18) = local_120._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x20) = local_110._0_4_;
    if ((gc_heap *)local_120._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_120._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x18));
    }
    ((slot *)((long)pvVar5 + 0x28))->representation = local_110._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x30) = local_110._16_4_;
    if ((gc_heap *)local_110._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_110._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x28));
    }
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&local_f8.allocation,
               (gc_heap_ptr<mjs::gc_string> *)&local_160,
               (gc_heap_ptr<mjs::gc_string> *)&local_170.allocation,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_f8.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_170.allocation);
    local_180.heap_ = (gc_heap *)local_190._M_len;
    local_180.pos_ = (uint32_t)local_190._M_str;
    if ((gc_heap *)local_190._M_len == (gc_heap *)0x0) {
      local_150.new_position = 5;
      local_148.representation = 0;
      local_140.new_position = (uint32_t)local_190._M_str;
    }
    else {
      gc_heap::attach((gc_heap *)local_190._M_len,&local_180);
      local_150.new_position = 5;
      local_148.representation = (uint64_t)local_180.heap_;
      local_140.new_position = local_180.pos_;
      if (local_180.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_180.heap_,(gc_heap_ptr_untyped *)&local_148.allocation);
      }
    }
    (**(code **)(*plVar3 + 8))(plVar3,&local_160,&local_150,2);
    value::destroy((value *)&local_150.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_180);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_190);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_160);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_110 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_120 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_e0.allocation);
    local_e0.representation = local_b0.representation;
    local_d8 = (char *)CONCAT44(local_d8._4_4_,local_a8);
    if ((gc_heap *)local_b0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_b0,(gc_heap_ptr_untyped *)&local_e0.allocation);
    }
    local_120._8_8_ = local_d0.heap_;
    local_110._0_4_ = local_d0.pos_;
    if (local_d0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)(local_120 + 8));
    }
    local_110._8_8_ = local_c0;
    local_110._16_4_ = local_b8;
    if ((gc_heap *)local_c0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_c0,(gc_heap_ptr_untyped *)(local_110 + 8));
    }
    local_a0._M_len = 0xe;
    local_a0._M_str = "getUTCFullYear";
    string::string((string *)&local_160,(global->super_gc_heap_ptr_untyped).heap_,&local_a0);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_e0.allocation);
    make_raw_function((mjs *)&local_190,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_190);
    local_170.representation = 0;
    local_168 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&local_f8.allocation,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_f8.allocation);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d5898;
    *(undefined8 *)((long)pvVar5 + 0x18) = local_120._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x20) = local_110._0_4_;
    if ((gc_heap *)local_120._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_120._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x18));
    }
    ((slot *)((long)pvVar5 + 0x28))->representation = local_110._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x30) = local_110._16_4_;
    if ((gc_heap *)local_110._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_110._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x28));
    }
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&local_f8.allocation,
               (gc_heap_ptr<mjs::gc_string> *)&local_160,
               (gc_heap_ptr<mjs::gc_string> *)&local_170.allocation,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_f8.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_170.allocation);
    local_180.heap_ = (gc_heap *)local_190._M_len;
    local_180.pos_ = (uint32_t)local_190._M_str;
    if ((gc_heap *)local_190._M_len == (gc_heap *)0x0) {
      local_150.new_position = 5;
      local_148.representation = 0;
      local_140.new_position = (uint32_t)local_190._M_str;
    }
    else {
      gc_heap::attach((gc_heap *)local_190._M_len,&local_180);
      local_150.new_position = 5;
      local_148.representation = (uint64_t)local_180.heap_;
      local_140.new_position = local_180.pos_;
      if (local_180.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_180.heap_,(gc_heap_ptr_untyped *)&local_148.allocation);
      }
    }
    (**(code **)(*plVar3 + 8))(plVar3,&local_160,&local_150,2);
    value::destroy((value *)&local_150.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_180);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_190);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_160);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_110 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_120 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_e0.allocation);
    local_e0.representation = local_b0.representation;
    local_d8 = (char *)CONCAT44(local_d8._4_4_,local_a8);
    if ((gc_heap *)local_b0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_b0,(gc_heap_ptr_untyped *)&local_e0.allocation);
    }
    local_120._8_8_ = local_d0.heap_;
    local_110._0_4_ = local_d0.pos_;
    if (local_d0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)(local_120 + 8));
    }
    local_110._8_8_ = local_c0;
    local_110._16_4_ = local_b8;
    if ((gc_heap *)local_c0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_c0,(gc_heap_ptr_untyped *)(local_110 + 8));
    }
    local_a0._M_len = 8;
    local_a0._M_str = "getMonth";
    string::string((string *)&local_160,(global->super_gc_heap_ptr_untyped).heap_,&local_a0);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_e0.allocation);
    make_raw_function((mjs *)&local_190,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_190);
    local_170.representation = 0;
    local_168 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&local_f8.allocation,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_f8.allocation);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d58d8;
    *(undefined8 *)((long)pvVar5 + 0x18) = local_120._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x20) = local_110._0_4_;
    if ((gc_heap *)local_120._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_120._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x18));
    }
    ((slot *)((long)pvVar5 + 0x28))->representation = local_110._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x30) = local_110._16_4_;
    if ((gc_heap *)local_110._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_110._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x28));
    }
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&local_f8.allocation,
               (gc_heap_ptr<mjs::gc_string> *)&local_160,
               (gc_heap_ptr<mjs::gc_string> *)&local_170.allocation,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_f8.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_170.allocation);
    local_180.heap_ = (gc_heap *)local_190._M_len;
    local_180.pos_ = (uint32_t)local_190._M_str;
    if ((gc_heap *)local_190._M_len == (gc_heap *)0x0) {
      local_150.new_position = 5;
      local_148.representation = 0;
      local_140.new_position = (uint32_t)local_190._M_str;
    }
    else {
      gc_heap::attach((gc_heap *)local_190._M_len,&local_180);
      local_150.new_position = 5;
      local_148.representation = (uint64_t)local_180.heap_;
      local_140.new_position = local_180.pos_;
      if (local_180.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_180.heap_,(gc_heap_ptr_untyped *)&local_148.allocation);
      }
    }
    (**(code **)(*plVar3 + 8))(plVar3,&local_160,&local_150,2);
    value::destroy((value *)&local_150.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_180);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_190);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_160);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_110 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_120 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_e0.allocation);
    local_e0.representation = local_b0.representation;
    local_d8 = (char *)CONCAT44(local_d8._4_4_,local_a8);
    if ((gc_heap *)local_b0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_b0,(gc_heap_ptr_untyped *)&local_e0.allocation);
    }
    local_120._8_8_ = local_d0.heap_;
    local_110._0_4_ = local_d0.pos_;
    if (local_d0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)(local_120 + 8));
    }
    local_110._8_8_ = local_c0;
    local_110._16_4_ = local_b8;
    if ((gc_heap *)local_c0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_c0,(gc_heap_ptr_untyped *)(local_110 + 8));
    }
    local_a0._M_len = 0xb;
    local_a0._M_str = "getUTCMonth";
    string::string((string *)&local_160,(global->super_gc_heap_ptr_untyped).heap_,&local_a0);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_e0.allocation);
    make_raw_function((mjs *)&local_190,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_190);
    local_170.representation = 0;
    local_168 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&local_f8.allocation,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_f8.allocation);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d5918;
    *(undefined8 *)((long)pvVar5 + 0x18) = local_120._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x20) = local_110._0_4_;
    if ((gc_heap *)local_120._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_120._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x18));
    }
    ((slot *)((long)pvVar5 + 0x28))->representation = local_110._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x30) = local_110._16_4_;
    if ((gc_heap *)local_110._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_110._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x28));
    }
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&local_f8.allocation,
               (gc_heap_ptr<mjs::gc_string> *)&local_160,
               (gc_heap_ptr<mjs::gc_string> *)&local_170.allocation,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_f8.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_170.allocation);
    local_180.heap_ = (gc_heap *)local_190._M_len;
    local_180.pos_ = (uint32_t)local_190._M_str;
    if ((gc_heap *)local_190._M_len == (gc_heap *)0x0) {
      local_150.new_position = 5;
      local_148.representation = 0;
      local_140.new_position = (uint32_t)local_190._M_str;
    }
    else {
      gc_heap::attach((gc_heap *)local_190._M_len,&local_180);
      local_150.new_position = 5;
      local_148.representation = (uint64_t)local_180.heap_;
      local_140.new_position = local_180.pos_;
      if (local_180.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_180.heap_,(gc_heap_ptr_untyped *)&local_148.allocation);
      }
    }
    (**(code **)(*plVar3 + 8))(plVar3,&local_160,&local_150,2);
    value::destroy((value *)&local_150.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_180);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_190);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_160);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_110 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_120 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_e0.allocation);
    local_e0.representation = local_b0.representation;
    local_d8 = (char *)CONCAT44(local_d8._4_4_,local_a8);
    if ((gc_heap *)local_b0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_b0,(gc_heap_ptr_untyped *)&local_e0.allocation);
    }
    local_120._8_8_ = local_d0.heap_;
    local_110._0_4_ = local_d0.pos_;
    if (local_d0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)(local_120 + 8));
    }
    local_110._8_8_ = local_c0;
    local_110._16_4_ = local_b8;
    if ((gc_heap *)local_c0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_c0,(gc_heap_ptr_untyped *)(local_110 + 8));
    }
    local_a0._M_len = 7;
    local_a0._M_str = "getDate";
    string::string((string *)&local_160,(global->super_gc_heap_ptr_untyped).heap_,&local_a0);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_e0.allocation);
    make_raw_function((mjs *)&local_190,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_190);
    local_170.representation = 0;
    local_168 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&local_f8.allocation,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_f8.allocation);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d5958;
    *(undefined8 *)((long)pvVar5 + 0x18) = local_120._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x20) = local_110._0_4_;
    if ((gc_heap *)local_120._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_120._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x18));
    }
    ((slot *)((long)pvVar5 + 0x28))->representation = local_110._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x30) = local_110._16_4_;
    if ((gc_heap *)local_110._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_110._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x28));
    }
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&local_f8.allocation,
               (gc_heap_ptr<mjs::gc_string> *)&local_160,
               (gc_heap_ptr<mjs::gc_string> *)&local_170.allocation,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_f8.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_170.allocation);
    local_180.heap_ = (gc_heap *)local_190._M_len;
    local_180.pos_ = (uint32_t)local_190._M_str;
    if ((gc_heap *)local_190._M_len == (gc_heap *)0x0) {
      local_150.new_position = 5;
      local_148.representation = 0;
      local_140.new_position = (uint32_t)local_190._M_str;
    }
    else {
      gc_heap::attach((gc_heap *)local_190._M_len,&local_180);
      local_150.new_position = 5;
      local_148.representation = (uint64_t)local_180.heap_;
      local_140.new_position = local_180.pos_;
      if (local_180.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_180.heap_,(gc_heap_ptr_untyped *)&local_148.allocation);
      }
    }
    (**(code **)(*plVar3 + 8))(plVar3,&local_160,&local_150,2);
    value::destroy((value *)&local_150.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_180);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_190);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_160);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_110 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_120 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_e0.allocation);
    local_e0.representation = local_b0.representation;
    local_d8 = (char *)CONCAT44(local_d8._4_4_,local_a8);
    if ((gc_heap *)local_b0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_b0,(gc_heap_ptr_untyped *)&local_e0.allocation);
    }
    local_120._8_8_ = local_d0.heap_;
    local_110._0_4_ = local_d0.pos_;
    if (local_d0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)(local_120 + 8));
    }
    local_110._8_8_ = local_c0;
    local_110._16_4_ = local_b8;
    if ((gc_heap *)local_c0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_c0,(gc_heap_ptr_untyped *)(local_110 + 8));
    }
    local_a0._M_len = 10;
    local_a0._M_str = "getUTCDate";
    string::string((string *)&local_160,(global->super_gc_heap_ptr_untyped).heap_,&local_a0);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_e0.allocation);
    make_raw_function((mjs *)&local_190,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_190);
    local_170.representation = 0;
    local_168 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&local_f8.allocation,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_f8.allocation);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d5998;
    *(undefined8 *)((long)pvVar5 + 0x18) = local_120._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x20) = local_110._0_4_;
    if ((gc_heap *)local_120._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_120._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x18));
    }
    ((slot *)((long)pvVar5 + 0x28))->representation = local_110._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x30) = local_110._16_4_;
    if ((gc_heap *)local_110._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_110._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x28));
    }
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&local_f8.allocation,
               (gc_heap_ptr<mjs::gc_string> *)&local_160,
               (gc_heap_ptr<mjs::gc_string> *)&local_170.allocation,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_f8.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_170.allocation);
    local_180.heap_ = (gc_heap *)local_190._M_len;
    local_180.pos_ = (uint32_t)local_190._M_str;
    if ((gc_heap *)local_190._M_len == (gc_heap *)0x0) {
      local_150.new_position = 5;
      local_148.representation = 0;
      local_140.new_position = (uint32_t)local_190._M_str;
    }
    else {
      gc_heap::attach((gc_heap *)local_190._M_len,&local_180);
      local_150.new_position = 5;
      local_148.representation = (uint64_t)local_180.heap_;
      local_140.new_position = local_180.pos_;
      if (local_180.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_180.heap_,(gc_heap_ptr_untyped *)&local_148.allocation);
      }
    }
    (**(code **)(*plVar3 + 8))(plVar3,&local_160,&local_150,2);
    value::destroy((value *)&local_150.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_180);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_190);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_160);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_110 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_120 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_e0.allocation);
    local_e0.representation = local_b0.representation;
    local_d8 = (char *)CONCAT44(local_d8._4_4_,local_a8);
    if ((gc_heap *)local_b0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_b0,(gc_heap_ptr_untyped *)&local_e0.allocation);
    }
    local_120._8_8_ = local_d0.heap_;
    local_110._0_4_ = local_d0.pos_;
    if (local_d0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)(local_120 + 8));
    }
    local_110._8_8_ = local_c0;
    local_110._16_4_ = local_b8;
    if ((gc_heap *)local_c0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_c0,(gc_heap_ptr_untyped *)(local_110 + 8));
    }
    local_a0._M_len = 6;
    local_a0._M_str = "getDay";
    string::string((string *)&local_160,(global->super_gc_heap_ptr_untyped).heap_,&local_a0);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_e0.allocation);
    make_raw_function((mjs *)&local_190,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_190);
    local_170.representation = 0;
    local_168 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&local_f8.allocation,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_f8.allocation);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d59d8;
    *(undefined8 *)((long)pvVar5 + 0x18) = local_120._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x20) = local_110._0_4_;
    if ((gc_heap *)local_120._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_120._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x18));
    }
    ((slot *)((long)pvVar5 + 0x28))->representation = local_110._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x30) = local_110._16_4_;
    if ((gc_heap *)local_110._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_110._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x28));
    }
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&local_f8.allocation,
               (gc_heap_ptr<mjs::gc_string> *)&local_160,
               (gc_heap_ptr<mjs::gc_string> *)&local_170.allocation,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_f8.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_170.allocation);
    local_180.heap_ = (gc_heap *)local_190._M_len;
    local_180.pos_ = (uint32_t)local_190._M_str;
    if ((gc_heap *)local_190._M_len == (gc_heap *)0x0) {
      local_150.new_position = 5;
      local_148.representation = 0;
      local_140.new_position = (uint32_t)local_190._M_str;
    }
    else {
      gc_heap::attach((gc_heap *)local_190._M_len,&local_180);
      local_150.new_position = 5;
      local_148.representation = (uint64_t)local_180.heap_;
      local_140.new_position = local_180.pos_;
      if (local_180.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_180.heap_,(gc_heap_ptr_untyped *)&local_148.allocation);
      }
    }
    (**(code **)(*plVar3 + 8))(plVar3,&local_160,&local_150,2);
    value::destroy((value *)&local_150.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_180);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_190);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_160);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_110 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_120 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_e0.allocation);
    local_e0.representation = local_b0.representation;
    local_d8 = (char *)CONCAT44(local_d8._4_4_,local_a8);
    if ((gc_heap *)local_b0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_b0,(gc_heap_ptr_untyped *)&local_e0.allocation);
    }
    local_120._8_8_ = local_d0.heap_;
    local_110._0_4_ = local_d0.pos_;
    if (local_d0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)(local_120 + 8));
    }
    local_110._8_8_ = local_c0;
    local_110._16_4_ = local_b8;
    if ((gc_heap *)local_c0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_c0,(gc_heap_ptr_untyped *)(local_110 + 8));
    }
    local_a0._M_len = 9;
    local_a0._M_str = "getUTCDay";
    string::string((string *)&local_160,(global->super_gc_heap_ptr_untyped).heap_,&local_a0);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_e0.allocation);
    make_raw_function((mjs *)&local_190,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_190);
    local_170.representation = 0;
    local_168 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&local_f8.allocation,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_f8.allocation);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d5a18;
    *(undefined8 *)((long)pvVar5 + 0x18) = local_120._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x20) = local_110._0_4_;
    if ((gc_heap *)local_120._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_120._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x18));
    }
    ((slot *)((long)pvVar5 + 0x28))->representation = local_110._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x30) = local_110._16_4_;
    if ((gc_heap *)local_110._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_110._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x28));
    }
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&local_f8.allocation,
               (gc_heap_ptr<mjs::gc_string> *)&local_160,
               (gc_heap_ptr<mjs::gc_string> *)&local_170.allocation,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_f8.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_170.allocation);
    local_180.heap_ = (gc_heap *)local_190._M_len;
    local_180.pos_ = (uint32_t)local_190._M_str;
    if ((gc_heap *)local_190._M_len == (gc_heap *)0x0) {
      local_150.new_position = 5;
      local_148.representation = 0;
      local_140.new_position = (uint32_t)local_190._M_str;
    }
    else {
      gc_heap::attach((gc_heap *)local_190._M_len,&local_180);
      local_150.new_position = 5;
      local_148.representation = (uint64_t)local_180.heap_;
      local_140.new_position = local_180.pos_;
      if (local_180.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_180.heap_,(gc_heap_ptr_untyped *)&local_148.allocation);
      }
    }
    (**(code **)(*plVar3 + 8))(plVar3,&local_160,&local_150,2);
    value::destroy((value *)&local_150.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_180);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_190);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_160);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_110 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_120 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_e0.allocation);
    local_e0.representation = local_b0.representation;
    local_d8 = (char *)CONCAT44(local_d8._4_4_,local_a8);
    if ((gc_heap *)local_b0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_b0,(gc_heap_ptr_untyped *)&local_e0.allocation);
    }
    local_120._8_8_ = local_d0.heap_;
    local_110._0_4_ = local_d0.pos_;
    if (local_d0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)(local_120 + 8));
    }
    local_110._8_8_ = local_c0;
    local_110._16_4_ = local_b8;
    if ((gc_heap *)local_c0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_c0,(gc_heap_ptr_untyped *)(local_110 + 8));
    }
    local_a0._M_len = 8;
    local_a0._M_str = "getHours";
    string::string((string *)&local_160,(global->super_gc_heap_ptr_untyped).heap_,&local_a0);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_e0.allocation);
    make_raw_function((mjs *)&local_190,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_190);
    local_170.representation = 0;
    local_168 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&local_f8.allocation,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_f8.allocation);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d5a58;
    *(undefined8 *)((long)pvVar5 + 0x18) = local_120._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x20) = local_110._0_4_;
    if ((gc_heap *)local_120._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_120._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x18));
    }
    ((slot *)((long)pvVar5 + 0x28))->representation = local_110._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x30) = local_110._16_4_;
    if ((gc_heap *)local_110._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_110._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x28));
    }
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&local_f8.allocation,
               (gc_heap_ptr<mjs::gc_string> *)&local_160,
               (gc_heap_ptr<mjs::gc_string> *)&local_170.allocation,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_f8.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_170.allocation);
    local_180.heap_ = (gc_heap *)local_190._M_len;
    local_180.pos_ = (uint32_t)local_190._M_str;
    if ((gc_heap *)local_190._M_len == (gc_heap *)0x0) {
      local_150.new_position = 5;
      local_148.representation = 0;
      local_140.new_position = (uint32_t)local_190._M_str;
    }
    else {
      gc_heap::attach((gc_heap *)local_190._M_len,&local_180);
      local_150.new_position = 5;
      local_148.representation = (uint64_t)local_180.heap_;
      local_140.new_position = local_180.pos_;
      if (local_180.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_180.heap_,(gc_heap_ptr_untyped *)&local_148.allocation);
      }
    }
    (**(code **)(*plVar3 + 8))(plVar3,&local_160,&local_150,2);
    value::destroy((value *)&local_150.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_180);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_190);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_160);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_110 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_120 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_e0.allocation);
    local_e0.representation = local_b0.representation;
    local_d8 = (char *)CONCAT44(local_d8._4_4_,local_a8);
    if ((gc_heap *)local_b0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_b0,(gc_heap_ptr_untyped *)&local_e0.allocation);
    }
    local_120._8_8_ = local_d0.heap_;
    local_110._0_4_ = local_d0.pos_;
    if (local_d0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)(local_120 + 8));
    }
    local_110._8_8_ = local_c0;
    local_110._16_4_ = local_b8;
    if ((gc_heap *)local_c0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_c0,(gc_heap_ptr_untyped *)(local_110 + 8));
    }
    local_a0._M_len = 0xb;
    local_a0._M_str = "getUTCHours";
    string::string((string *)&local_160,(global->super_gc_heap_ptr_untyped).heap_,&local_a0);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_e0.allocation);
    make_raw_function((mjs *)&local_190,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_190);
    local_170.representation = 0;
    local_168 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&local_f8.allocation,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_f8.allocation);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d5a98;
    *(undefined8 *)((long)pvVar5 + 0x18) = local_120._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x20) = local_110._0_4_;
    if ((gc_heap *)local_120._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_120._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x18));
    }
    ((slot *)((long)pvVar5 + 0x28))->representation = local_110._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x30) = local_110._16_4_;
    if ((gc_heap *)local_110._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_110._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x28));
    }
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&local_f8.allocation,
               (gc_heap_ptr<mjs::gc_string> *)&local_160,
               (gc_heap_ptr<mjs::gc_string> *)&local_170.allocation,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_f8.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_170.allocation);
    local_180.heap_ = (gc_heap *)local_190._M_len;
    local_180.pos_ = (uint32_t)local_190._M_str;
    if ((gc_heap *)local_190._M_len == (gc_heap *)0x0) {
      local_150.new_position = 5;
      local_148.representation = 0;
      local_140.new_position = (uint32_t)local_190._M_str;
    }
    else {
      gc_heap::attach((gc_heap *)local_190._M_len,&local_180);
      local_150.new_position = 5;
      local_148.representation = (uint64_t)local_180.heap_;
      local_140.new_position = local_180.pos_;
      if (local_180.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_180.heap_,(gc_heap_ptr_untyped *)&local_148.allocation);
      }
    }
    (**(code **)(*plVar3 + 8))(plVar3,&local_160,&local_150,2);
    value::destroy((value *)&local_150.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_180);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_190);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_160);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_110 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_120 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_e0.allocation);
    local_e0.representation = local_b0.representation;
    local_d8 = (char *)CONCAT44(local_d8._4_4_,local_a8);
    if ((gc_heap *)local_b0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_b0,(gc_heap_ptr_untyped *)&local_e0.allocation);
    }
    local_120._8_8_ = local_d0.heap_;
    local_110._0_4_ = local_d0.pos_;
    if (local_d0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)(local_120 + 8));
    }
    local_110._8_8_ = local_c0;
    local_110._16_4_ = local_b8;
    if ((gc_heap *)local_c0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_c0,(gc_heap_ptr_untyped *)(local_110 + 8));
    }
    local_a0._M_len = 10;
    local_a0._M_str = "getMinutes";
    string::string((string *)&local_160,(global->super_gc_heap_ptr_untyped).heap_,&local_a0);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_e0.allocation);
    make_raw_function((mjs *)&local_190,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_190);
    local_170.representation = 0;
    local_168 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&local_f8.allocation,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_f8.allocation);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d5ad8;
    *(undefined8 *)((long)pvVar5 + 0x18) = local_120._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x20) = local_110._0_4_;
    if ((gc_heap *)local_120._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_120._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x18));
    }
    ((slot *)((long)pvVar5 + 0x28))->representation = local_110._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x30) = local_110._16_4_;
    if ((gc_heap *)local_110._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_110._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x28));
    }
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&local_f8.allocation,
               (gc_heap_ptr<mjs::gc_string> *)&local_160,
               (gc_heap_ptr<mjs::gc_string> *)&local_170.allocation,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_f8.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_170.allocation);
    local_180.heap_ = (gc_heap *)local_190._M_len;
    local_180.pos_ = (uint32_t)local_190._M_str;
    if ((gc_heap *)local_190._M_len == (gc_heap *)0x0) {
      local_150.new_position = 5;
      local_148.representation = 0;
      local_140.new_position = (uint32_t)local_190._M_str;
    }
    else {
      gc_heap::attach((gc_heap *)local_190._M_len,&local_180);
      local_150.new_position = 5;
      local_148.representation = (uint64_t)local_180.heap_;
      local_140.new_position = local_180.pos_;
      if (local_180.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_180.heap_,(gc_heap_ptr_untyped *)&local_148.allocation);
      }
    }
    (**(code **)(*plVar3 + 8))(plVar3,&local_160,&local_150,2);
    value::destroy((value *)&local_150.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_180);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_190);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_160);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_110 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_120 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_e0.allocation);
    local_e0.representation = local_b0.representation;
    local_d8 = (char *)CONCAT44(local_d8._4_4_,local_a8);
    if ((gc_heap *)local_b0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_b0,(gc_heap_ptr_untyped *)&local_e0.allocation);
    }
    local_120._8_8_ = local_d0.heap_;
    local_110._0_4_ = local_d0.pos_;
    if (local_d0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)(local_120 + 8));
    }
    local_110._8_8_ = local_c0;
    local_110._16_4_ = local_b8;
    if ((gc_heap *)local_c0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_c0,(gc_heap_ptr_untyped *)(local_110 + 8));
    }
    local_a0._M_len = 0xd;
    local_a0._M_str = "getUTCMinutes";
    string::string((string *)&local_160,(global->super_gc_heap_ptr_untyped).heap_,&local_a0);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_e0.allocation);
    make_raw_function((mjs *)&local_190,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_190);
    local_170.representation = 0;
    local_168 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&local_f8.allocation,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_f8.allocation);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d5b18;
    *(undefined8 *)((long)pvVar5 + 0x18) = local_120._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x20) = local_110._0_4_;
    if ((gc_heap *)local_120._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_120._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x18));
    }
    ((slot *)((long)pvVar5 + 0x28))->representation = local_110._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x30) = local_110._16_4_;
    if ((gc_heap *)local_110._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_110._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x28));
    }
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&local_f8.allocation,
               (gc_heap_ptr<mjs::gc_string> *)&local_160,
               (gc_heap_ptr<mjs::gc_string> *)&local_170.allocation,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_f8.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_170.allocation);
    local_180.heap_ = (gc_heap *)local_190._M_len;
    local_180.pos_ = (uint32_t)local_190._M_str;
    if ((gc_heap *)local_190._M_len == (gc_heap *)0x0) {
      local_150.new_position = 5;
      local_148.representation = 0;
      local_140.new_position = (uint32_t)local_190._M_str;
    }
    else {
      gc_heap::attach((gc_heap *)local_190._M_len,&local_180);
      local_150.new_position = 5;
      local_148.representation = (uint64_t)local_180.heap_;
      local_140.new_position = local_180.pos_;
      if (local_180.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_180.heap_,(gc_heap_ptr_untyped *)&local_148.allocation);
      }
    }
    (**(code **)(*plVar3 + 8))(plVar3,&local_160,&local_150,2);
    value::destroy((value *)&local_150.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_180);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_190);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_160);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_110 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_120 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_e0.allocation);
    local_e0.representation = local_b0.representation;
    local_d8 = (char *)CONCAT44(local_d8._4_4_,local_a8);
    if ((gc_heap *)local_b0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_b0,(gc_heap_ptr_untyped *)&local_e0.allocation);
    }
    local_120._8_8_ = local_d0.heap_;
    local_110._0_4_ = local_d0.pos_;
    if (local_d0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)(local_120 + 8));
    }
    local_110._8_8_ = local_c0;
    local_110._16_4_ = local_b8;
    if ((gc_heap *)local_c0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_c0,(gc_heap_ptr_untyped *)(local_110 + 8));
    }
    local_a0._M_len = 10;
    local_a0._M_str = "getSeconds";
    string::string((string *)&local_160,(global->super_gc_heap_ptr_untyped).heap_,&local_a0);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_e0.allocation);
    make_raw_function((mjs *)&local_190,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_190);
    local_170.representation = 0;
    local_168 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&local_f8.allocation,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_f8.allocation);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d5b58;
    *(undefined8 *)((long)pvVar5 + 0x18) = local_120._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x20) = local_110._0_4_;
    if ((gc_heap *)local_120._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_120._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x18));
    }
    ((slot *)((long)pvVar5 + 0x28))->representation = local_110._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x30) = local_110._16_4_;
    if ((gc_heap *)local_110._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_110._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x28));
    }
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&local_f8.allocation,
               (gc_heap_ptr<mjs::gc_string> *)&local_160,
               (gc_heap_ptr<mjs::gc_string> *)&local_170.allocation,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_f8.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_170.allocation);
    local_180.heap_ = (gc_heap *)local_190._M_len;
    local_180.pos_ = (uint32_t)local_190._M_str;
    if ((gc_heap *)local_190._M_len == (gc_heap *)0x0) {
      local_150.new_position = 5;
      local_148.representation = 0;
      local_140.new_position = (uint32_t)local_190._M_str;
    }
    else {
      gc_heap::attach((gc_heap *)local_190._M_len,&local_180);
      local_150.new_position = 5;
      local_148.representation = (uint64_t)local_180.heap_;
      local_140.new_position = local_180.pos_;
      if (local_180.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_180.heap_,(gc_heap_ptr_untyped *)&local_148.allocation);
      }
    }
    (**(code **)(*plVar3 + 8))(plVar3,&local_160,&local_150,2);
    value::destroy((value *)&local_150.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_180);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_190);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_160);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_110 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_120 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_e0.allocation);
    local_e0.representation = local_b0.representation;
    local_d8 = (char *)CONCAT44(local_d8._4_4_,local_a8);
    if ((gc_heap *)local_b0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_b0,(gc_heap_ptr_untyped *)&local_e0.allocation);
    }
    local_120._8_8_ = local_d0.heap_;
    local_110._0_4_ = local_d0.pos_;
    if (local_d0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)(local_120 + 8));
    }
    local_110._8_8_ = local_c0;
    local_110._16_4_ = local_b8;
    if ((gc_heap *)local_c0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_c0,(gc_heap_ptr_untyped *)(local_110 + 8));
    }
    local_a0._M_len = 0xd;
    local_a0._M_str = "getUTCSeconds";
    string::string((string *)&local_160,(global->super_gc_heap_ptr_untyped).heap_,&local_a0);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_e0.allocation);
    make_raw_function((mjs *)&local_190,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_190);
    local_170.representation = 0;
    local_168 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&local_f8.allocation,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_f8.allocation);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d5b98;
    *(undefined8 *)((long)pvVar5 + 0x18) = local_120._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x20) = local_110._0_4_;
    if ((gc_heap *)local_120._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_120._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x18));
    }
    ((slot *)((long)pvVar5 + 0x28))->representation = local_110._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x30) = local_110._16_4_;
    if ((gc_heap *)local_110._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_110._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x28));
    }
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&local_f8.allocation,
               (gc_heap_ptr<mjs::gc_string> *)&local_160,
               (gc_heap_ptr<mjs::gc_string> *)&local_170.allocation,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_f8.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_170.allocation);
    local_180.heap_ = (gc_heap *)local_190._M_len;
    local_180.pos_ = (uint32_t)local_190._M_str;
    if ((gc_heap *)local_190._M_len == (gc_heap *)0x0) {
      local_150.new_position = 5;
      local_148.representation = 0;
      local_140.new_position = (uint32_t)local_190._M_str;
    }
    else {
      gc_heap::attach((gc_heap *)local_190._M_len,&local_180);
      local_150.new_position = 5;
      local_148.representation = (uint64_t)local_180.heap_;
      local_140.new_position = local_180.pos_;
      if (local_180.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_180.heap_,(gc_heap_ptr_untyped *)&local_148.allocation);
      }
    }
    (**(code **)(*plVar3 + 8))(plVar3,&local_160,&local_150,2);
    value::destroy((value *)&local_150.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_180);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_190);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_160);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_110 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_120 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_e0.allocation);
    local_e0.representation = local_b0.representation;
    local_d8 = (char *)CONCAT44(local_d8._4_4_,local_a8);
    if ((gc_heap *)local_b0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_b0,(gc_heap_ptr_untyped *)&local_e0.allocation);
    }
    local_120._8_8_ = local_d0.heap_;
    local_110._0_4_ = local_d0.pos_;
    if (local_d0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)(local_120 + 8));
    }
    local_110._8_8_ = local_c0;
    local_110._16_4_ = local_b8;
    if ((gc_heap *)local_c0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_c0,(gc_heap_ptr_untyped *)(local_110 + 8));
    }
    local_a0._M_len = 0xf;
    local_a0._M_str = "getMilliseconds";
    string::string((string *)&local_160,(global->super_gc_heap_ptr_untyped).heap_,&local_a0);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_e0.allocation);
    make_raw_function((mjs *)&local_190,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_190);
    local_170.representation = 0;
    local_168 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&local_f8.allocation,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_f8.allocation);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d5bd8;
    *(undefined8 *)((long)pvVar5 + 0x18) = local_120._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x20) = local_110._0_4_;
    if ((gc_heap *)local_120._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_120._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x18));
    }
    ((slot *)((long)pvVar5 + 0x28))->representation = local_110._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x30) = local_110._16_4_;
    if ((gc_heap *)local_110._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_110._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x28));
    }
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&local_f8.allocation,
               (gc_heap_ptr<mjs::gc_string> *)&local_160,
               (gc_heap_ptr<mjs::gc_string> *)&local_170.allocation,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_f8.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_170.allocation);
    local_180.heap_ = (gc_heap *)local_190._M_len;
    local_180.pos_ = (uint32_t)local_190._M_str;
    if ((gc_heap *)local_190._M_len == (gc_heap *)0x0) {
      local_150.new_position = 5;
      local_148.representation = 0;
      local_140.new_position = (uint32_t)local_190._M_str;
    }
    else {
      gc_heap::attach((gc_heap *)local_190._M_len,&local_180);
      local_150.new_position = 5;
      local_148.representation = (uint64_t)local_180.heap_;
      local_140.new_position = local_180.pos_;
      if (local_180.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_180.heap_,(gc_heap_ptr_untyped *)&local_148.allocation);
      }
    }
    (**(code **)(*plVar3 + 8))(plVar3,&local_160,&local_150,2);
    value::destroy((value *)&local_150.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_180);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_190);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_160);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_110 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_120 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_e0.allocation);
    local_e0.representation = local_b0.representation;
    local_d8 = (char *)CONCAT44(local_d8._4_4_,local_a8);
    if ((gc_heap *)local_b0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_b0,(gc_heap_ptr_untyped *)&local_e0.allocation);
    }
    local_120._8_8_ = local_d0.heap_;
    local_110._0_4_ = local_d0.pos_;
    if (local_d0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)(local_120 + 8));
    }
    local_110._8_8_ = local_c0;
    local_110._16_4_ = local_b8;
    if ((gc_heap *)local_c0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_c0,(gc_heap_ptr_untyped *)(local_110 + 8));
    }
    local_a0._M_len = 0x12;
    local_a0._M_str = "getUTCMilliseconds";
    string::string((string *)&local_160,(global->super_gc_heap_ptr_untyped).heap_,&local_a0);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_e0.allocation);
    make_raw_function((mjs *)&local_190,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_190);
    local_170.representation = 0;
    local_168 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&local_f8.allocation,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_f8.allocation);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d5c18;
    *(undefined8 *)((long)pvVar5 + 0x18) = local_120._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x20) = local_110._0_4_;
    if ((gc_heap *)local_120._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_120._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x18));
    }
    ((slot *)((long)pvVar5 + 0x28))->representation = local_110._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x30) = local_110._16_4_;
    if ((gc_heap *)local_110._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_110._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x28));
    }
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&local_f8.allocation,
               (gc_heap_ptr<mjs::gc_string> *)&local_160,
               (gc_heap_ptr<mjs::gc_string> *)&local_170.allocation,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_f8.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_170.allocation);
    local_180.heap_ = (gc_heap *)local_190._M_len;
    local_180.pos_ = (uint32_t)local_190._M_str;
    if ((gc_heap *)local_190._M_len == (gc_heap *)0x0) {
      local_150.new_position = 5;
      local_148.representation = 0;
      local_140.new_position = (uint32_t)local_190._M_str;
    }
    else {
      gc_heap::attach((gc_heap *)local_190._M_len,&local_180);
      local_150.new_position = 5;
      local_148.representation = (uint64_t)local_180.heap_;
      local_140.new_position = local_180.pos_;
      if (local_180.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_180.heap_,(gc_heap_ptr_untyped *)&local_148.allocation);
      }
    }
    (**(code **)(*plVar3 + 8))(plVar3,&local_160,&local_150,2);
    value::destroy((value *)&local_150.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_180);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_190);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_160);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_110 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_120 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_e0.allocation);
    local_e0.representation = local_b0.representation;
    local_d8 = (char *)CONCAT44(local_d8._4_4_,local_a8);
    if ((gc_heap *)local_b0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_b0,(gc_heap_ptr_untyped *)&local_e0.allocation);
    }
    local_120._8_8_ = local_d0.heap_;
    local_110._0_4_ = local_d0.pos_;
    if (local_d0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)(local_120 + 8));
    }
    local_110._8_8_ = local_c0;
    local_110._16_4_ = local_b8;
    if ((gc_heap *)local_c0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_c0,(gc_heap_ptr_untyped *)(local_110 + 8));
    }
    local_a0._M_len = 0x11;
    local_a0._M_str = "getTimezoneOffset";
    string::string((string *)&local_160,(global->super_gc_heap_ptr_untyped).heap_,&local_a0);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_e0.allocation);
    make_raw_function((mjs *)&local_190,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_190);
    local_170.representation = 0;
    local_168 = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&local_f8.allocation,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_f8.allocation);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d5c58;
    *(undefined8 *)((long)pvVar5 + 0x18) = local_120._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x20) = local_110._0_4_;
    if ((gc_heap *)local_120._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_120._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x18));
    }
    ((slot *)((long)pvVar5 + 0x28))->representation = local_110._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x30) = local_110._16_4_;
    if ((gc_heap *)local_110._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_110._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x28));
    }
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&local_f8.allocation,
               (gc_heap_ptr<mjs::gc_string> *)&local_160,
               (gc_heap_ptr<mjs::gc_string> *)&local_170.allocation,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_f8.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_170.allocation);
    local_180.heap_ = (gc_heap *)local_190._M_len;
    local_180.pos_ = (uint32_t)local_190._M_str;
    if ((gc_heap *)local_190._M_len == (gc_heap *)0x0) {
      local_150.new_position = 5;
      local_148.representation = 0;
      local_140.new_position = (uint32_t)local_190._M_str;
    }
    else {
      gc_heap::attach((gc_heap *)local_190._M_len,&local_180);
      local_150.new_position = 5;
      local_148.representation = (uint64_t)local_180.heap_;
      local_140.new_position = local_180.pos_;
      if (local_180.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_180.heap_,(gc_heap_ptr_untyped *)&local_148.allocation);
      }
    }
    (**(code **)(*plVar3 + 8))(plVar3,&local_160,&local_150,2);
    value::destroy((value *)&local_150.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_180);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_190);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_160);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_110 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_120 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_e0.allocation);
    local_f8.representation = (uint64_t)&local_d0;
    local_e8 = &local_b0;
    local_40.prototype = (gc_heap_ptr<mjs::date_object> *)local_e8;
    local_40.h = local_48;
    local_70.make_date_mutator = (anon_class_24_3_cfd939b3 *)&local_f8;
    local_70.copy_func = &local_40;
    local_90.representation = local_b0.representation;
    local_88 = local_a8;
    local_f0 = global;
    if ((gc_heap *)local_b0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_b0,(gc_heap_ptr_untyped *)&local_90.allocation);
    }
    sVar1 = local_f8;
    local_120._8_8_ = *(undefined8 *)local_f8;
    local_110._0_4_ = *(uint32_t *)(local_f8.representation + 8);
    if ((gc_heap *)local_120._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_120._8_8_,(gc_heap_ptr_untyped *)(local_120 + 8));
    }
    local_110._8_8_ = ((gc_heap_ptr_untyped *)(sVar1.representation + 0x10))->heap_;
    local_110._16_4_ = *(uint32_t *)(sVar1.representation + 0x18);
    if ((gc_heap *)local_110._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_110._8_8_,(gc_heap_ptr_untyped *)(local_110 + 8));
    }
    local_e0.representation = 7;
    local_d8 = "setTime";
    string::string((string *)&local_a0,(global->super_gc_heap_ptr_untyped).heap_,
                   (string_view *)&local_e0.allocation);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_90.allocation);
    make_raw_function((mjs *)&local_160,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get(&local_160);
    local_180.heap_ = (gc_heap *)0x0;
    local_180.pos_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&local_170.allocation,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_170.allocation);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d5c98;
    *(undefined8 *)((long)pvVar5 + 0x18) = local_120._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x20) = local_110._0_4_;
    if ((gc_heap *)local_120._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_120._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x18));
    }
    *(undefined8 *)((long)pvVar5 + 0x28) = local_110._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x30) = local_110._16_4_;
    if ((gc_heap *)local_110._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_110._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x28));
    }
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&local_170.allocation,
               (gc_heap_ptr<mjs::gc_string> *)&local_a0,(gc_heap_ptr<mjs::gc_string> *)&local_180,0)
    ;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_170.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_180);
    local_190._M_len = (size_t)local_160.heap_;
    local_190._M_str = (char *)CONCAT44(local_190._M_str._4_4_,local_160.pos_);
    if (local_160.heap_ == (gc_heap *)0x0) {
      local_150.new_position = 5;
      local_148.representation = 0;
      local_140.new_position = local_160.pos_;
    }
    else {
      gc_heap::attach(local_160.heap_,(gc_heap_ptr_untyped *)&local_190);
      local_150.new_position = 5;
      local_148.representation = local_190._M_len;
      local_140.new_position = (uint32_t)local_190._M_str;
      if ((gc_heap *)local_190._M_len != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_190._M_len,(gc_heap_ptr_untyped *)&local_148.allocation);
      }
    }
    (**(code **)(*plVar3 + 8))(plVar3,&local_a0,&local_150,2);
    value::destroy((value *)&local_150.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_190);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_160);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_a0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_110 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_120 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_90.allocation);
    make_date_object::anon_class_16_2_4c7e7635::operator()
              (&local_70,"setMilliseconds",0x30,0xffffffffffffffff,0xffffffffffffffff,
               0xffffffffffffffff);
    make_date_object::anon_class_16_2_4c7e7635::operator()
              (&local_70,"setSeconds",0x28,0x30,0xffffffffffffffff,0xffffffffffffffff);
    make_date_object::anon_class_16_2_4c7e7635::operator()
              (&local_70,"setMinutes",0x20,0x28,0x30,0xffffffffffffffff);
    make_date_object::anon_class_16_2_4c7e7635::operator()(&local_70,"setHours",0x18,0x20,0x28,0x30)
    ;
    make_date_object::anon_class_16_2_4c7e7635::operator()
              (&local_70,"setDate",0x10,0xffffffffffffffff,0xffffffffffffffff,0xffffffffffffffff);
    make_date_object::anon_class_16_2_4c7e7635::operator()
              (&local_70,"setMonth",8,0x10,0xffffffffffffffff,0xffffffffffffffff);
    make_date_object::anon_class_16_2_4c7e7635::operator()
              (&local_70,"setFullYear",0,8,0x10,0xffffffffffffffff);
    global_00 = local_f0;
    local_90.allocation = (slot_allocation_header)local_e8->representation;
    local_88 = local_e8[1].new_position;
    if ((gc_heap *)local_90.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_90,(gc_heap_ptr_untyped *)&local_90.allocation);
    }
    sVar1 = local_f8;
    local_120._8_8_ = *(undefined8 *)local_f8;
    local_110._0_4_ = *(uint32_t *)(local_f8.representation + 8);
    if ((gc_heap *)local_120._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_120._8_8_,(gc_heap_ptr_untyped *)(local_120 + 8));
    }
    local_110._8_8_ = ((gc_heap_ptr_untyped *)(sVar1.representation + 0x10))->heap_;
    local_110._16_4_ = *(uint32_t *)(sVar1.representation + 0x18);
    if ((gc_heap *)local_110._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_110._8_8_,(gc_heap_ptr_untyped *)(local_110 + 8));
    }
    local_e0.representation = 7;
    local_d8 = "setYear";
    string::string((string *)&local_a0,(global_00->super_gc_heap_ptr_untyped).heap_,
                   (string_view *)&local_e0.allocation);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_90.allocation);
    make_raw_function((mjs *)&local_160,global_00);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get(&local_160);
    local_180.heap_ = (gc_heap *)0x0;
    local_180.pos_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&local_170.allocation,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_170.allocation);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d5d18;
    *(undefined8 *)((long)pvVar5 + 0x18) = local_120._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x20) = local_110._0_4_;
    if ((gc_heap *)local_120._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_120._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x18));
    }
    *(undefined8 *)((long)pvVar5 + 0x28) = local_110._8_8_;
    *(undefined4 *)((long)pvVar5 + 0x30) = local_110._16_4_;
    if ((gc_heap *)local_110._8_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_110._8_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x28));
    }
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&local_170.allocation,
               (gc_heap_ptr<mjs::gc_string> *)&local_a0,(gc_heap_ptr<mjs::gc_string> *)&local_180,0)
    ;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_170.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_180);
    local_190._M_len = (size_t)local_160.heap_;
    local_190._M_str = (char *)CONCAT44(local_190._M_str._4_4_,local_160.pos_);
    if (local_160.heap_ == (gc_heap *)0x0) {
      local_150.new_position = 5;
      local_148.representation = 0;
      local_140.new_position = local_160.pos_;
    }
    else {
      gc_heap::attach(local_160.heap_,(gc_heap_ptr_untyped *)&local_190);
      local_150.new_position = 5;
      local_148.representation = local_190._M_len;
      local_140.new_position = (uint32_t)local_190._M_str;
      if ((gc_heap *)local_190._M_len != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_190._M_len,(gc_heap_ptr_untyped *)&local_148.allocation);
      }
    }
    (**(code **)(*plVar3 + 8))(plVar3,&local_a0,&local_150,2);
    value::destroy((value *)&local_150.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_190);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_160);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_a0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_110 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_120 + 8));
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_90.allocation);
    local_90.representation = local_b0.representation;
    local_88 = local_a8;
    if ((gc_heap *)local_b0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_b0,(gc_heap_ptr_untyped *)&local_90.allocation);
    }
    local_120._0_8_ = local_d0.heap_;
    local_120._8_4_ = local_d0.pos_;
    if (local_d0.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)local_120);
    }
    local_110._0_8_ = local_c0;
    local_110._8_4_ = local_b8;
    if ((gc_heap *)local_c0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_c0,(gc_heap_ptr_untyped *)local_110);
    }
    local_e0.representation = 8;
    local_d8 = "toString";
    string::string((string *)&local_a0,(global->super_gc_heap_ptr_untyped).heap_,
                   (string_view *)&local_e0.allocation);
    plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_90.allocation);
    make_raw_function((mjs *)&local_160,global);
    pfVar4 = (function_object *)gc_heap_ptr_untyped::get(&local_160);
    local_180.heap_ = (gc_heap *)0x0;
    local_180.pos_ = 0;
    gc_heap::allocate_and_construct<mjs::gc_function>
              ((gc_heap *)&local_170.allocation,
               (size_t)(pfVar4->super_native_object).super_object.heap_);
    pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_170.allocation);
    *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d5e58;
    *(undefined8 *)((long)pvVar5 + 0x10) = local_120._0_8_;
    *(undefined4 *)((long)pvVar5 + 0x18) = local_120._8_4_;
    if ((gc_heap *)local_120._0_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_120._0_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x10));
    }
    ((slot *)((long)pvVar5 + 0x20))->representation = local_110._0_8_;
    *(undefined4 *)((long)pvVar5 + 0x28) = local_110._8_4_;
    if ((gc_heap *)local_110._0_8_ != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_110._0_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x20));
    }
    function_object::put_function
              (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&local_170.allocation,
               (gc_heap_ptr<mjs::gc_string> *)&local_a0,(gc_heap_ptr<mjs::gc_string> *)&local_180,0)
    ;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_170.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_180);
    local_190._M_len = (size_t)local_160.heap_;
    local_190._M_str = (char *)CONCAT44(local_190._M_str._4_4_,local_160.pos_);
    if (local_160.heap_ == (gc_heap *)0x0) {
      local_150.new_position = 5;
      local_148.representation = 0;
      local_140.new_position = local_160.pos_;
    }
    else {
      gc_heap::attach(local_160.heap_,(gc_heap_ptr_untyped *)&local_190);
      local_150.new_position = 5;
      local_148.representation = local_190._M_len;
      local_140.new_position = (uint32_t)local_190._M_str;
      if ((gc_heap *)local_190._M_len != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_190._M_len,(gc_heap_ptr_untyped *)&local_148.allocation);
      }
    }
    (**(code **)(*plVar3 + 8))(plVar3,&local_a0,&local_150,2);
    value::destroy((value *)&local_150.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_190);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_160);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_a0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_110);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_120);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_90.allocation);
    make_date_object::anon_class_16_2_9fb1826f::operator()(&local_40,L"toString",L"toLocaleString");
    make_date_object::anon_class_16_2_9fb1826f::operator()(&local_40,L"toString",L"toUTCString");
    make_date_object::anon_class_16_2_9fb1826f::operator()(&local_40,L"toString",L"toGMTString");
    pvVar5 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    if (0 < *(int *)((long)pvVar5 + 0x20)) {
      local_90.representation = local_b0.representation;
      local_88 = local_a8;
      if ((gc_heap *)local_b0.representation != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_b0,(gc_heap_ptr_untyped *)&local_90.allocation);
      }
      local_120._0_8_ = local_d0.heap_;
      local_120._8_4_ = local_d0.pos_;
      if (local_d0.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)local_120);
      }
      local_110._0_8_ = local_c0;
      local_110._8_4_ = local_b8;
      if ((gc_heap *)local_c0.representation != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_c0,(gc_heap_ptr_untyped *)local_110);
      }
      local_e0.representation = 0xc;
      local_d8 = "toTimeString";
      string::string((string *)&local_a0,(global->super_gc_heap_ptr_untyped).heap_,
                     (string_view *)&local_e0.allocation);
      plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_90.allocation);
      make_raw_function((mjs *)&local_160,global);
      pfVar4 = (function_object *)gc_heap_ptr_untyped::get(&local_160);
      local_180.heap_ = (gc_heap *)0x0;
      local_180.pos_ = 0;
      gc_heap::allocate_and_construct<mjs::gc_function>
                ((gc_heap *)&local_170.allocation,
                 (size_t)(pfVar4->super_native_object).super_object.heap_);
      pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_170.allocation);
      *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d5e98;
      *(undefined8 *)((long)pvVar5 + 0x10) = local_120._0_8_;
      *(undefined4 *)((long)pvVar5 + 0x18) = local_120._8_4_;
      if ((gc_heap *)local_120._0_8_ != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_120._0_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x10));
      }
      ((slot *)((long)pvVar5 + 0x20))->representation = local_110._0_8_;
      *(undefined4 *)((long)pvVar5 + 0x28) = local_110._8_4_;
      if ((gc_heap *)local_110._0_8_ != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_110._0_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x20));
      }
      function_object::put_function
                (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&local_170.allocation,
                 (gc_heap_ptr<mjs::gc_string> *)&local_a0,(gc_heap_ptr<mjs::gc_string> *)&local_180,
                 0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_170.allocation);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_180);
      local_190._M_len = (size_t)local_160.heap_;
      local_190._M_str = (char *)CONCAT44(local_190._M_str._4_4_,local_160.pos_);
      if (local_160.heap_ == (gc_heap *)0x0) {
        local_150.new_position = 5;
        local_148.representation = 0;
        local_140.new_position = local_160.pos_;
      }
      else {
        gc_heap::attach(local_160.heap_,(gc_heap_ptr_untyped *)&local_190);
        local_150.new_position = 5;
        local_148.representation = local_190._M_len;
        local_140.new_position = (uint32_t)local_190._M_str;
        if ((gc_heap *)local_190._M_len != (gc_heap *)0x0) {
          gc_heap::attach((gc_heap *)local_190._M_len,(gc_heap_ptr_untyped *)&local_148.allocation);
        }
      }
      (**(code **)(*plVar3 + 8))(plVar3,&local_a0,&local_150,2);
      value::destroy((value *)&local_150.allocation);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_190);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_160);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_a0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_110);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_120);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_90.allocation);
      local_90.representation = local_b0.representation;
      local_88 = local_a8;
      if ((gc_heap *)local_b0.representation != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_b0,(gc_heap_ptr_untyped *)&local_90.allocation);
      }
      local_120._0_8_ = local_d0.heap_;
      local_120._8_4_ = local_d0.pos_;
      if (local_d0.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)local_120);
      }
      local_110._0_8_ = local_c0;
      local_110._8_4_ = local_b8;
      if ((gc_heap *)local_c0.representation != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_c0,(gc_heap_ptr_untyped *)local_110);
      }
      local_e0.representation = 0xc;
      local_d8 = "toDateString";
      string::string((string *)&local_a0,(global->super_gc_heap_ptr_untyped).heap_,
                     (string_view *)&local_e0.allocation);
      plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_90.allocation);
      make_raw_function((mjs *)&local_160,global);
      pfVar4 = (function_object *)gc_heap_ptr_untyped::get(&local_160);
      local_180.heap_ = (gc_heap *)0x0;
      local_180.pos_ = 0;
      gc_heap::allocate_and_construct<mjs::gc_function>
                ((gc_heap *)&local_170.allocation,
                 (size_t)(pfVar4->super_native_object).super_object.heap_);
      pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_170.allocation);
      *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d5ed8;
      *(undefined8 *)((long)pvVar5 + 0x10) = local_120._0_8_;
      *(undefined4 *)((long)pvVar5 + 0x18) = local_120._8_4_;
      if ((gc_heap *)local_120._0_8_ != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_120._0_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x10));
      }
      ((slot *)((long)pvVar5 + 0x20))->representation = local_110._0_8_;
      *(undefined4 *)((long)pvVar5 + 0x28) = local_110._8_4_;
      if ((gc_heap *)local_110._0_8_ != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_110._0_8_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x20));
      }
      function_object::put_function
                (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&local_170.allocation,
                 (gc_heap_ptr<mjs::gc_string> *)&local_a0,(gc_heap_ptr<mjs::gc_string> *)&local_180,
                 0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_170.allocation);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_180);
      local_190._M_len = (size_t)local_160.heap_;
      local_190._M_str = (char *)CONCAT44(local_190._M_str._4_4_,local_160.pos_);
      if (local_160.heap_ == (gc_heap *)0x0) {
        local_150.new_position = 5;
        local_148.representation = 0;
        local_140.new_position = local_160.pos_;
      }
      else {
        gc_heap::attach(local_160.heap_,(gc_heap_ptr_untyped *)&local_190);
        local_150.new_position = 5;
        local_148.representation = local_190._M_len;
        local_140.new_position = (uint32_t)local_190._M_str;
        if ((gc_heap *)local_190._M_len != (gc_heap *)0x0) {
          gc_heap::attach((gc_heap *)local_190._M_len,(gc_heap_ptr_untyped *)&local_148.allocation);
        }
      }
      (**(code **)(*plVar3 + 8))(plVar3,&local_a0,&local_150,2);
      value::destroy((value *)&local_150.allocation);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_190);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_160);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_a0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_110);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_120);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_90.allocation);
      make_date_object::anon_class_16_2_9fb1826f::operator()
                (&local_40,L"toTimeString",L"toLocaleTimeString");
      make_date_object::anon_class_16_2_9fb1826f::operator()
                (&local_40,L"toDateString",L"toLocaleDateString");
    }
    pvVar5 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
    if (1 < *(int *)((long)pvVar5 + 0x20)) {
      local_e0.representation = (uint64_t)local_80.heap_;
      local_d8 = (char *)CONCAT44(local_d8._4_4_,local_80.pos_);
      if (local_80.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_80.heap_,(gc_heap_ptr_untyped *)&local_e0.allocation);
      }
      local_a0._M_len = 3;
      local_a0._M_str = "now";
      string::string((string *)&local_160,(global->super_gc_heap_ptr_untyped).heap_,&local_a0);
      plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_e0.allocation);
      make_raw_function((mjs *)&local_190,global);
      pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_190);
      local_170.representation = 0;
      local_168 = 0;
      gc_heap::allocate_and_construct<mjs::gc_function>
                ((gc_heap *)local_120,(size_t)(pfVar4->super_native_object).super_object.heap_);
      pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_120);
      *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d5f18;
      function_object::put_function
                (pfVar4,(gc_heap_ptr<mjs::gc_function> *)local_120,
                 (gc_heap_ptr<mjs::gc_string> *)&local_160,
                 (gc_heap_ptr<mjs::gc_string> *)&local_170.allocation,0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_120);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_170.allocation);
      local_180.heap_ = (gc_heap *)local_190._M_len;
      local_180.pos_ = (uint32_t)local_190._M_str;
      if ((gc_heap *)local_190._M_len == (gc_heap *)0x0) {
        local_150.new_position = 5;
        local_148.representation = 0;
        local_140.new_position = (uint32_t)local_190._M_str;
      }
      else {
        gc_heap::attach((gc_heap *)local_190._M_len,&local_180);
        local_150.new_position = 5;
        local_148.representation = (uint64_t)local_180.heap_;
        local_140.new_position = local_180.pos_;
        if (local_180.heap_ != (gc_heap *)0x0) {
          gc_heap::attach(local_180.heap_,(gc_heap_ptr_untyped *)&local_148.allocation);
        }
      }
      (**(code **)(*plVar3 + 8))(plVar3,&local_160,&local_150,2);
      value::destroy((value *)&local_150.allocation);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_180);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_190);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_160);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_e0.allocation);
      local_90.representation = local_b0.representation;
      local_88 = local_a8;
      if ((gc_heap *)local_b0.representation != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_b0,(gc_heap_ptr_untyped *)&local_90.allocation);
      }
      local_150.representation = (uint64_t)local_d0.heap_;
      local_148.new_position = local_d0.pos_;
      if (local_d0.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_d0.heap_,(gc_heap_ptr_untyped *)&local_150.allocation);
      }
      local_140.representation = local_c0.representation;
      local_138 = local_b8;
      if ((gc_heap *)local_c0.representation != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_c0,(gc_heap_ptr_untyped *)&local_140.allocation);
      }
      local_130.heap_ = (global->super_gc_heap_ptr_untyped).heap_;
      local_130.pos_ = (global->super_gc_heap_ptr_untyped).pos_;
      gc_heap::attach(local_130.heap_,&local_130);
      local_e0.representation = 0xb;
      local_d8 = "toISOString";
      string::string((string *)&local_a0,(global->super_gc_heap_ptr_untyped).heap_,
                     (string_view *)&local_e0.allocation);
      plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_90.allocation);
      make_raw_function((mjs *)&local_160,global);
      pfVar4 = (function_object *)gc_heap_ptr_untyped::get(&local_160);
      local_180.heap_ = (gc_heap *)0x0;
      local_180.pos_ = 0;
      gc_heap::allocate_and_construct<mjs::gc_function>
                ((gc_heap *)&local_170.allocation,
                 (size_t)(pfVar4->super_native_object).super_object.heap_);
      pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_170.allocation);
      *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d5f58;
      ((slot *)((long)pvVar5 + 0x10))->representation = (uint64_t)local_150;
      *(uint32_t *)((long)pvVar5 + 0x18) = local_148.new_position;
      if ((gc_heap *)local_150.representation != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_150,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x10));
      }
      ((slot *)((long)pvVar5 + 0x20))->representation = (uint64_t)local_140;
      *(uint32_t *)((long)pvVar5 + 0x28) = local_138;
      if ((gc_heap *)local_140.representation != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_140,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x20));
      }
      *(gc_heap **)((long)pvVar5 + 0x30) = local_130.heap_;
      *(uint32_t *)((long)pvVar5 + 0x38) = local_130.pos_;
      if (local_130.heap_ != (gc_heap *)0x0) {
        gc_heap::attach(local_130.heap_,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x30));
      }
      function_object::put_function
                (pfVar4,(gc_heap_ptr<mjs::gc_function> *)&local_170.allocation,
                 (gc_heap_ptr<mjs::gc_string> *)&local_a0,(gc_heap_ptr<mjs::gc_string> *)&local_180,
                 0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_170.allocation);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_180);
      local_190._M_len = (size_t)local_160.heap_;
      local_190._M_str = (char *)CONCAT44(local_190._M_str._4_4_,local_160.pos_);
      if (local_160.heap_ == (gc_heap *)0x0) {
        local_120._0_4_ = 5;
        local_120._8_8_ = (gc_heap *)0x0;
        local_110._0_4_ = local_160.pos_;
      }
      else {
        gc_heap::attach(local_160.heap_,(gc_heap_ptr_untyped *)&local_190);
        local_120._0_4_ = 5;
        local_120._8_8_ = local_190._M_len;
        local_110._0_4_ = (uint32_t)local_190._M_str;
        if ((gc_heap *)local_190._M_len != (gc_heap *)0x0) {
          gc_heap::attach((gc_heap *)local_190._M_len,(gc_heap_ptr_untyped *)(local_120 + 8));
        }
      }
      (**(code **)(*plVar3 + 8))(plVar3,&local_a0,local_120,2);
      value::destroy((value *)local_120);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_190);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_160);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_a0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_130);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_140.allocation);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_150.allocation);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_90.allocation);
      local_e0.representation = local_b0.representation;
      local_d8 = (char *)CONCAT44(local_d8._4_4_,local_a8);
      if ((gc_heap *)local_b0.representation != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_b0,(gc_heap_ptr_untyped *)&local_e0.allocation);
      }
      local_90.allocation = (slot_allocation_header)(global->super_gc_heap_ptr_untyped).heap_;
      local_88 = (global->super_gc_heap_ptr_untyped).pos_;
      gc_heap::attach((gc_heap *)local_90,(gc_heap_ptr_untyped *)&local_90.allocation);
      local_a0._M_len = 6;
      local_a0._M_str = "toJSON";
      string::string((string *)&local_160,(global->super_gc_heap_ptr_untyped).heap_,&local_a0);
      plVar3 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_e0.allocation);
      make_raw_function((mjs *)&local_190,global);
      pfVar4 = (function_object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_190);
      local_170.representation = 0;
      local_168 = 0;
      gc_heap::allocate_and_construct<mjs::gc_function>
                ((gc_heap *)local_120,(size_t)(pfVar4->super_native_object).super_object.heap_);
      pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_120);
      *(undefined ***)((long)pvVar5 + 8) = &PTR_destroy_001d5f98;
      ((slot *)((long)pvVar5 + 0x10))->representation = (uint64_t)local_90;
      *(uint32_t *)((long)pvVar5 + 0x18) = local_88;
      if ((gc_heap *)local_90.representation != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_90,(gc_heap_ptr_untyped *)((long)pvVar5 + 0x10));
      }
      function_object::put_function
                (pfVar4,(gc_heap_ptr<mjs::gc_function> *)local_120,
                 (gc_heap_ptr<mjs::gc_string> *)&local_160,
                 (gc_heap_ptr<mjs::gc_string> *)&local_170.allocation,1);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_120);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_170.allocation);
      local_180.heap_ = (gc_heap *)local_190._M_len;
      local_180.pos_ = (uint32_t)local_190._M_str;
      if ((gc_heap *)local_190._M_len == (gc_heap *)0x0) {
        local_150.new_position = 5;
        local_148.representation = 0;
        local_140.new_position = (uint32_t)local_190._M_str;
      }
      else {
        gc_heap::attach((gc_heap *)local_190._M_len,&local_180);
        local_150.new_position = 5;
        local_148.representation = (uint64_t)local_180.heap_;
        local_140.new_position = local_180.pos_;
        if (local_180.heap_ != (gc_heap *)0x0) {
          gc_heap::attach(local_180.heap_,(gc_heap_ptr_untyped *)&local_148.allocation);
        }
      }
      (**(code **)(*plVar3 + 8))(plVar3,&local_160,&local_150,2);
      value::destroy((value *)&local_150.allocation);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_180);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_190);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_160);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_90.allocation);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_e0.allocation);
    }
    (local_50->obj).super_gc_heap_ptr_untyped.heap_ = local_80.heap_;
    (local_50->obj).super_gc_heap_ptr_untyped.pos_ = local_80.pos_;
    if (local_80.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_80.heap_,(gc_heap_ptr_untyped *)local_50);
    }
    pgVar2 = local_50;
    (local_50->prototype).super_gc_heap_ptr_untyped.heap_ = (gc_heap *)local_b0;
    (local_50->prototype).super_gc_heap_ptr_untyped.pos_ = local_a8;
    if ((gc_heap *)local_b0.representation != (gc_heap *)0x0) {
      gc_heap::attach((gc_heap *)local_b0,&(local_50->prototype).super_gc_heap_ptr_untyped);
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_c0.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_80);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_60.allocation);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_b0.allocation);
    return pgVar2;
  }
  __assert_fail("!construct_ && f",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/function_object.h"
                ,0x45,
                "void mjs::function_object::construct_function(const gc_heap_ptr<gc_function> &)");
}

Assistant:

global_object_create_result make_date_object(const gc_heap_ptr<global_object>& global) {
    auto& h = global.heap();

    auto prototype = h.make<date_object>(string{h, "Date"}, global->object_prototype(), NAN);

    auto new_date = [prototype](double val) {
        return prototype.heap().make<date_object>(prototype->class_name(), prototype, val);
    };

    auto c = make_function(global, [prototype, new_date](const value&, const std::vector<value>&) {
        // Equivalent to (new Date()).toString()
        return value{to_string(prototype.heap(), value{new_date(date_helper::current_time_utc())})};
    }, prototype->class_name().unsafe_raw_get(), 7);
    make_constructable(global, c, [new_date](const value&, const std::vector<value>& args) {
        if (args.empty()) {
            return value{new_date(date_helper::current_time_utc())};
        } else if (args.size() == 1) {
            auto v = to_primitive(args[0]);
            if (v.type() == value_type::string) {
                // return Date.parse(v)
                return value{new_date(date_helper::parse(v.string_value().view()))};
            }
            return value{new_date(to_number(v))};
        } else if (args.size() == 2) {
            NOT_IMPLEMENTED("new Date(value)");
        }
        return value{date_helper::time_clip(date_helper::utc(date_helper::time_from_args(args)))};
    });

    prototype->put(global->common_string("constructor"), value{c}, global_object::default_attributes);

    put_native_function(global, c, "parse", [&h](const value&, const std::vector<value>& args) {
        if (!args.empty()) {
            const auto s = to_string(h, args.front());
            return value{date_helper::parse(s.view())};
        }
        return value{NAN};
    }, 1);
    put_native_function(global, c, "UTC", [](const value&, const std::vector<value>& args) {
        if (args.size() < 3) {
            NOT_IMPLEMENTED("Date.UTC() with less than 3 arguments");
        }
        return value{date_helper::time_clip(date_helper::time_from_args(args))};
    }, 7);

    auto get_data_object = [global, prototype](const value& this_) {
        global->validate_type(this_, prototype, "Date");
        return gc_heap_ptr<date_object>{this_.object_value()};
    };

    auto make_date_getter = [&](const char* name, auto f) {
        put_native_function(global, prototype, name ,[f, get_data_object](const value& this_, const std::vector<value>&) {
            const double t = get_data_object(this_)->date_value();
            if (std::isnan(t)) {
                return value{t};
            }
            return value{static_cast<double>(f(t))};
        }, 0);
    };
    make_date_getter("valueOf", [](double t) { return t; });
    make_date_getter("getTime", [](double t) { return t; });
    make_date_getter("getYear", [](double t) {
        return date_helper::year_from_time(date_helper::local_time(t)) - 1900;
    });
    make_date_getter("getFullYear", [](double t) {
        return date_helper::year_from_time(date_helper::local_time(t));
    });
    make_date_getter("getUTCFullYear", [](double t) {
        return date_helper::year_from_time(t);
    });
    make_date_getter("getMonth", [](double t) {
        return date_helper::month_from_time(date_helper::local_time(t));
    });
    make_date_getter("getUTCMonth", [](double t) {
        return date_helper::month_from_time(t);
    });
    make_date_getter("getDate", [](double t) {
        return date_helper::date_from_time(date_helper::local_time(t));
    });
    make_date_getter("getUTCDate", [](double t) {
        return date_helper::date_from_time(t);
    });
    make_date_getter("getDay", [](double t) {
        return date_helper::week_day(date_helper::local_time(t));
    });
    make_date_getter("getUTCDay", [](double t) {
        return date_helper::week_day(t);
    });
    make_date_getter("getHours", [](double t) {
        return date_helper::hour_from_time(date_helper::local_time(t));
    });
    make_date_getter("getUTCHours", [](double t) {
        return date_helper::hour_from_time(t);
    });
    make_date_getter("getMinutes", [](double t) {
        return date_helper::min_from_time(date_helper::local_time(t));
    });
    make_date_getter("getUTCMinutes", [](double t) {
        return date_helper::min_from_time(t);
    });
    make_date_getter("getSeconds", [](double t) {
        return date_helper::sec_from_time(date_helper::local_time(t));
    });
    make_date_getter("getUTCSeconds", [](double t) {
        return date_helper::sec_from_time(t);
    });
    make_date_getter("getMilliseconds", [](double t) {
        return date_helper::ms_from_time(date_helper::local_time(t));
    });
    make_date_getter("getUTCMilliseconds", [](double t) {
        return date_helper::ms_from_time(t);
    });
    make_date_getter("getTimezoneOffset", [](double t) {
        return (t - date_helper::local_time(t)) / date_helper::ms_per_minute;
    });

    auto make_date_mutator = [&](const char* name, auto f) {
        put_native_function(global, prototype, name, [f, get_data_object](const value& this_, const std::vector<value>& args) {
            auto d = get_data_object(this_);
            const auto v = f(d->date_value(), !args.empty() ? to_number(args[0]) : NAN, args);
            d->date_value(v);
            return value{v};
        }, 0);
    };

    auto copy_func = [&](const wchar_t* from, const wchar_t* to) {
        prototype->put(string{h, to}, prototype->get(from), prototype->own_property_attributes(from));
    };

    using field_ptr = double date_time::*;

    auto make_simple_date_mutator = [&](const char* name, field_ptr field0, field_ptr field1 = nullptr, field_ptr field2 = nullptr, field_ptr field3 = nullptr) {
        make_date_mutator(name, [field0, field1, field2, field3](double current, double arg, const std::vector<value>& args) {
            auto dt = date_helper::date_time_from_time(current);
            dt.*field0 = arg;
            if (field1 && args.size() > 1) dt.*field1 = to_number(args[1]);
            if (field2 && args.size() > 2) dt.*field2 = to_number(args[2]);
            if (field3 && args.size() > 3) dt.*field3 = to_number(args[3]);
            return date_helper::time_from_date_time(dt);
        });
        const std::wstring from{name, name+std::strlen(name)};
        assert(from.compare(0, 3, L"set") == 0);
        copy_func(from.c_str(), (L"setUTC" + from.substr(3)).c_str());
    };

    make_date_mutator("setTime", [](double, double arg, const std::vector<value>&) {
        return arg;
    });

    make_simple_date_mutator("setMilliseconds", &date_time::ms);
    make_simple_date_mutator("setSeconds", &date_time::s, &date_time::ms);
    make_simple_date_mutator("setMinutes", &date_time::m, &date_time::s, &date_time::ms);
    make_simple_date_mutator("setHours", &date_time::h, &date_time::m, &date_time::s, &date_time::ms);
    make_simple_date_mutator("setDate", &date_time::day);
    make_simple_date_mutator("setMonth", &date_time::month, &date_time::day);
    make_simple_date_mutator("setFullYear", &date_time::year, &date_time::month, &date_time::day);

    make_date_mutator("setYear", [](double current, double arg, const std::vector<value>&) {
        auto dt = date_helper::date_time_from_time(current);
        dt.year = arg + 1900;
        return date_helper::time_from_date_time(dt);
    });

    put_native_function(global, prototype, "toString", [get_data_object](const value& this_, const std::vector<value>&) {
        auto o = get_data_object(this_);
        return value{date_helper::to_string(o.heap(), o->date_value())};
    }, 0);

    copy_func(L"toString", L"toLocaleString");
    copy_func(L"toString", L"toUTCString");
    copy_func(L"toString", L"toGMTString");

    if (global->language_version() >= version::es3) {
        put_native_function(global, prototype, "toTimeString", [get_data_object](const value& this_, const std::vector<value>&) {
            auto o = get_data_object(this_);
            return value{date_helper::to_time_string(o.heap(), o->date_value())};
        }, 0);

        put_native_function(global, prototype, "toDateString", [get_data_object](const value& this_, const std::vector<value>&) {
            auto o = get_data_object(this_);
            return value{date_helper::to_date_string(o.heap(), o->date_value())};
        }, 0);

        copy_func(L"toTimeString", L"toLocaleTimeString");
        copy_func(L"toDateString", L"toLocaleDateString");
    }

    if (global->language_version() >= version::es5) {
        put_native_function(global, c, "now", [](const value&, const std::vector<value>&) {
            return value{date_helper::current_time_utc()};
        }, 0);

        put_native_function(global, prototype, "toISOString", [get_data_object, global](const value& this_, const std::vector<value>&) {
            auto o = get_data_object(this_);
            return value{date_helper::to_iso_string(global, o->date_value())};
        }, 0);

        put_native_function(global, prototype, "toJSON", [global](const value& this_, const std::vector<value>&) {
            return date_helper::to_json(global, this_);
        }, 1);
    }

    return { c, prototype };
}